

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_fcadd_s_aarch64(void *vd,void *vn,void *vm,void *vg,void *vs,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  int32_t sign;
  float32 a;
  float32 fVar3;
  float32 fVar4;
  float32 fVar5;
  long lVar6;
  float32 e3;
  float32 e2;
  float32 e1;
  float32 e0;
  uint64_t pg;
  float32 neg_real;
  float32 neg_imag;
  uint64_t *g;
  intptr_t i;
  intptr_t j;
  uint32_t desc_local;
  void *vs_local;
  void *vg_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  g = (uint64_t *)simd_oprsz(desc);
  sign = simd_data(desc);
  a = float32_set_sign(0,sign);
  fVar3 = float32_chs(a);
  do {
    uVar2 = *(ulong *)((long)vg + ((long)g + -1 >> 6) * 8);
    do {
      lVar6 = (long)g + -4;
      g = g + -1;
      fVar5 = *(float32 *)((long)vn + lVar6);
      uVar1 = *(uint *)((long)vm + (long)g);
      if ((uVar2 >> ((byte)g & 0x3f) & 1) != 0) {
        fVar4 = float32_add_aarch64(*(float32 *)((long)vn + (long)g),
                                    *(uint *)((long)vm + lVar6) ^ fVar3,(float_status *)vs);
        *(float32 *)((long)vd + (long)g) = fVar4;
      }
      if ((uVar2 >> ((byte)lVar6 & 0x3f) & 1) != 0) {
        fVar5 = float32_add_aarch64(fVar5,uVar1 ^ a,(float_status *)vs);
        *(float32 *)((long)vd + lVar6) = fVar5;
      }
    } while (((ulong)g & 0x3f) != 0);
  } while (g != (uint64_t *)0x0);
  return;
}

Assistant:

void HELPER(sve_fcadd_s)(void *vd, void *vn, void *vm, void *vg,
                         void *vs, uint32_t desc)
{
    intptr_t j, i = simd_oprsz(desc);
    uint64_t *g = vg;
    float32 neg_imag = float32_set_sign(0, simd_data(desc));
    float32 neg_real = float32_chs(neg_imag);

    do {
        uint64_t pg = g[(i - 1) >> 6];
        do {
            float32 e0, e1, e2, e3;

            /* I holds the real index; J holds the imag index.  */
            j = i - sizeof(float32);
            i -= 2 * sizeof(float32);

            e0 = *(float32 *)((char *)vn + H1_2(i));
            e1 = *(float32 *)((char *)vm + H1_2(j)) ^ neg_real;
            e2 = *(float32 *)((char *)vn + H1_2(j));
            e3 = *(float32 *)((char *)vm + H1_2(i)) ^ neg_imag;

            if (likely((pg >> (i & 63)) & 1)) {
                *(float32 *)((char *)vd + H1_2(i)) = float32_add(e0, e1, vs);
            }
            if (likely((pg >> (j & 63)) & 1)) {
                *(float32 *)((char *)vd + H1_2(j)) = float32_add(e2, e3, vs);
            }
        } while (i & 63);
    } while (i != 0);
}